

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::getInputs
          (ShaderAtomicAddCase *this,int numValues,int stride,void *inputs)

{
  deUint32 seed;
  int max;
  int iVar1;
  char *str;
  int local_3c;
  int valNdx;
  int minVal;
  int maxVal;
  Random rnd;
  void *inputs_local;
  int stride_local;
  int numValues_local;
  ShaderAtomicAddCase *this_local;
  
  rnd.m_rnd._8_8_ = inputs;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)&minVal,seed);
  max = 0x20;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP) {
    max = 2;
  }
  for (local_3c = 0; local_3c < numValues; local_3c = local_3c + 1) {
    iVar1 = de::Random::getInt((Random *)&minVal,1,max);
    *(int *)(rnd.m_rnd._8_8_ + (long)(stride * local_3c)) = iVar1;
  }
  de::Random::~Random((Random *)&minVal);
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random	rnd			(deStringHash(getName()));
		const int	maxVal		= m_precision == PRECISION_LOWP ? 2 : 32;
		const int	minVal		= 1;

		// \todo [2013-09-04 pyry] Negative values!

		for (int valNdx = 0; valNdx < numValues; valNdx++)
			*(int*)((deUint8*)inputs + stride*valNdx) = rnd.getInt(minVal, maxVal);
	}